

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_image_function.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  exception *ex;
  Image imageOut;
  Image imageIn2;
  Image imageIn1;
  uint8_t in_stack_ffffffffffffff56;
  uint8_t in_stack_ffffffffffffff57;
  uint32_t in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  uchar in_stack_ffffffffffffff6f;
  Image *in_stack_ffffffffffffff70;
  Image *in_stack_ffffffffffffff78;
  Image *in_stack_ffffffffffffff80;
  Image *in_stack_ffffffffffffffa0;
  Image *in_stack_ffffffffffffffa8;
  Image *in_stack_ffffffffffffffb0;
  Image *in_stack_ffffffffffffffe0;
  Image *in_stack_ffffffffffffffe8;
  Image *in_stack_fffffffffffffff0;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff57,in_stack_ffffffffffffff56);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff57,in_stack_ffffffffffffff56);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff57,in_stack_ffffffffffffff56);
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  example1(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  example2(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  example3(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  example4(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x10252a);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x102534);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x102541);
  this = std::operator<<((ostream *)&std::cout,"Application ended correctly.");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    // This example is to show how you can perform bitwise operations on gray-scale images
    //
    // Conditions:
    // We are in the middle of very serious image processing algorithm development
    //
    // We have 2 input images and 1 output image with known sizes:
    // - first input image is 1024 x 1024 pixels
    // - second input image is 2048 x 2048 pixels
    // - output image (where we would like to store results) is 512 x 512 pixel
    //
    // We have to make bitwise OR on 2 input images and store result in output image
    // We know that the area in first input image has coordinates { [10, 10], [138, 138] },
    // second input image - { [650, 768], [778, 896] },
    // and we need to put result into area { [0, 0], [128, 128] } in output image
    //
    // So let's do it!

    try // <---- do not forget to put your code into try.. catch block!
    {
        // create image objects with certain sizes

        PenguinV_Image::Image imageIn1( 1024, 1024 );
        PenguinV_Image::Image imageIn2( 2048, 2048 );
        PenguinV_Image::Image imageOut( 512, 512 );

        // set any data because initially images contain some uninitialized garbage
        // (we assume that this step you do not need to do during real development of image processing algorithms)
        imageIn1.fill( 255 );
        imageIn2.fill( 128 );
        imageOut.fill( 0 );

        // Now we need to make bitwise operation OR
        // First way to do
        example1( imageIn1, imageIn2, imageOut );

        // Second way to do
        example2( imageIn1, imageIn2, imageOut );

        // Third way to do
        example3( imageIn1, imageIn2, imageOut );

        // Forth way to do
        example4( imageIn1, imageIn2, imageOut );
    }
    catch( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << "Exception " << ex.what() << " raised. Closing the application..." << std::endl;
        return 1;
    }
    catch( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Closing the application..." << std::endl;
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}